

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O1

MXFReader * __thiscall
AS_02::ACES::MXFReader::FillAncillaryResourceList
          (MXFReader *this,ResourceList_t *ancillary_resources)

{
  _List_node_base *p_Var1;
  char cVar2;
  undefined1 *in_RDX;
  undefined1 *puVar3;
  
  p_Var1 = (ancillary_resources->
           super__List_base<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  puVar3 = Kumu::RESULT_INIT;
  if (p_Var1 != (_List_node_base *)0x0) {
    cVar2 = (*(code *)(p_Var1[1]._M_next)->_M_next[4]._M_next)();
    if (cVar2 != '\0') {
      puVar3 = Kumu::RESULT_OK;
      if (&(ancillary_resources->
           super__List_base<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
           )._M_impl._M_node.super__List_node_base._M_prev[0x53]._M_prev !=
          (_List_node_base **)in_RDX) {
        std::__cxx11::
        list<AS_02::ACES::AncillaryResourceDescriptor,std::allocator<AS_02::ACES::AncillaryResourceDescriptor>>
        ::_M_assign_dispatch<std::_List_const_iterator<AS_02::ACES::AncillaryResourceDescriptor>>();
      }
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar3);
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::MXFReader::FillAncillaryResourceList(AS_02::ACES::ResourceList_t &ancillary_resources) const
{

  if(m_Reader && m_Reader->m_File->IsOpen())
  {
    ancillary_resources = m_Reader->m_Anc_Resources;
    return RESULT_OK;
  }
  return RESULT_INIT;
}